

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_import.c
# Opt level: O0

REF_STATUS
ref_import_bin_ugrid_bound_tag
          (REF_CELL ref_cell,REF_INT ncell,FILE *file,REF_BOOL swap,REF_BOOL fat)

{
  int iVar1;
  uint uVar2;
  REF_INT *chunk_00;
  int local_5c;
  int local_58;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT *tag;
  REF_INT cell;
  REF_INT chunk;
  REF_INT nread;
  REF_INT max_chunk;
  REF_INT node_per;
  REF_BOOL fat_local;
  REF_BOOL swap_local;
  FILE *file_local;
  REF_INT ncell_local;
  REF_CELL ref_cell_local;
  
  if (0 < ncell) {
    iVar1 = ref_cell->node_per;
    local_58 = ncell;
    if (1000000 < ncell) {
      local_58 = 1000000;
    }
    if (local_58 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             0x210,"ref_import_bin_ugrid_bound_tag","malloc tag of REF_INT negative");
      return 1;
    }
    chunk_00 = (REF_INT *)malloc((long)local_58 << 2);
    if (chunk_00 == (REF_INT *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             0x210,"ref_import_bin_ugrid_bound_tag","malloc tag of REF_INT NULL");
      return 2;
    }
    for (cell = 0; cell < ncell; cell = local_5c + cell) {
      if (local_58 < ncell - cell) {
        local_5c = local_58;
      }
      else {
        local_5c = ncell - cell;
      }
      uVar2 = ref_import_bin_ugrid_chunk(file,swap,fat,local_5c,chunk_00);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
               0x214,"ref_import_bin_ugrid_bound_tag",(ulong)uVar2,"tag");
        return uVar2;
      }
      for (tag._4_4_ = 0; tag._4_4_ < local_5c; tag._4_4_ = tag._4_4_ + 1) {
        ref_cell->c2n[iVar1 + ref_cell->size_per * (cell + tag._4_4_)] = chunk_00[tag._4_4_];
      }
    }
    if (chunk_00 != (REF_INT *)0x0) {
      free(chunk_00);
    }
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_import_bin_ugrid_bound_tag(
    REF_CELL ref_cell, REF_INT ncell, FILE *file, REF_BOOL swap, REF_BOOL fat) {
  REF_INT node_per, max_chunk, nread, chunk, cell;
  REF_INT *tag;

  if (0 < ncell) {
    node_per = ref_cell_node_per(ref_cell);
    max_chunk = MIN(1000000, ncell);
    ref_malloc(tag, max_chunk, REF_INT);
    nread = 0;
    while (nread < ncell) {
      chunk = MIN(max_chunk, ncell - nread);
      RSS(ref_import_bin_ugrid_chunk(file, swap, fat, chunk, tag), "tag");
      for (cell = 0; cell < chunk; cell++) {
        ref_cell_c2n(ref_cell, node_per, nread + cell) = tag[cell];
      }
      nread += chunk;
    }
    ref_free(tag);
  }

  return REF_SUCCESS;
}